

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d2bc6b::HandleInstallMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  cmake *this;
  cmInstalledFile *this_00;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  _Base_ptr local_40;
  undefined8 local_38;
  
  this = cmMakefile::GetCMakeInstance(status->Makefile);
  p_Var1 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(names->_M_t)._M_impl.super__Rb_tree_header;
  bVar3 = (_Rb_tree_header *)p_Var1 == p_Var2;
  if (!bVar3) {
    do {
      this_00 = cmake::GetOrCreateInstalledFile(this,status->Makefile,(string *)(p_Var1 + 1));
      if (this_00 == (cmInstalledFile *)0x0) {
        local_38 = *(undefined8 *)(p_Var1 + 1);
        local_40 = p_Var1[1]._M_parent;
        local_50._M_len = 0x37;
        local_50._M_str = "given INSTALL name that could not be found or created: ";
        views._M_len = 2;
        views._M_array = &local_50;
        cmCatViews_abi_cxx11_(&local_70,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else if (remove) {
        cmInstalledFile::RemoveProperty(this_00,propertyName);
      }
      else if (appendMode) {
        cmInstalledFile::AppendProperty
                  (this_00,status->Makefile,propertyName,propertyValue,appendAsString);
      }
      else {
        cmInstalledFile::SetProperty(this_00,status->Makefile,propertyName,propertyValue);
      }
      if (this_00 == (cmInstalledFile *)0x0) {
        return bVar3;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      bVar3 = (_Rb_tree_header *)p_Var1 == p_Var2;
    } while (!bVar3);
  }
  return bVar3;
}

Assistant:

bool HandleInstallMode(cmExecutionStatus& status,
                       const std::set<std::string>& names,
                       const std::string& propertyName,
                       const std::string& propertyValue, bool appendAsString,
                       bool appendMode, bool remove)
{
  cmake* cm = status.GetMakefile().GetCMakeInstance();

  for (std::string const& name : names) {
    if (cmInstalledFile* file =
          cm->GetOrCreateInstalledFile(&status.GetMakefile(), name)) {
      if (!HandleInstall(file, status.GetMakefile(), propertyName,
                         propertyValue, appendAsString, appendMode, remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat(
        "given INSTALL name that could not be found or created: ", name));
      return false;
    }
  }
  return true;
}